

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O2

XformEvaluator * __thiscall
tinyusdz::anon_unknown_4::XformEvaluator::RotateX(XformEvaluator *this,double angle)

{
  matrix4d *in_RCX;
  long lVar1;
  matrix4d *pmVar2;
  matrix4d *pmVar3;
  byte bVar4;
  double dVar5;
  matrix4d ret;
  matrix4d m;
  
  bVar4 = 0;
  m.m[0][0] = 1.0;
  m.m[0][1] = 0.0;
  m.m[0][2] = 0.0;
  m.m[0][3] = 0.0;
  m.m[1][0] = 0.0;
  m.m[1][3] = 0.0;
  m.m[2][0] = 0.0;
  m.m[2][3] = 0.0;
  m.m[3][0] = 0.0;
  m.m[3][1] = 0.0;
  m.m[3][2] = 0.0;
  m.m[3][3] = 1.0;
  dVar5 = math::cos_pi_imp<double>(angle / 180.0);
  m.m[1][2] = math::sin_pi_imp<double>(angle / 180.0);
  m.m[2][1] = -m.m[1][2];
  m.m[1][1] = dVar5;
  m.m[2][2] = dVar5;
  tinyusdz::value::Mult<tinyusdz::value::matrix4d,double,4ul>(&ret,(value *)&this->m,&m,in_RCX);
  pmVar2 = &ret;
  pmVar3 = &this->m;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    pmVar3->m[0][0] = pmVar2->m[0][0];
    pmVar2 = (matrix4d *)((long)pmVar2 + ((ulong)bVar4 * -2 + 1) * 8);
    pmVar3 = (matrix4d *)((long)pmVar3 + (ulong)bVar4 * -0x10 + 8);
  }
  return this;
}

Assistant:

XformEvaluator &RotateX(const double angle) {  // in degrees

    value::matrix4d rm = value::matrix4d::identity();

    double k = angle / 180.0;
    double c = math::cos_pi(k);
    double s = math::sin_pi(k);

    rm.m[1][1] = c;
    rm.m[1][2] = s;
    rm.m[2][1] = -s;
    rm.m[2][2] = c;

    m = m * rm;

    return (*this);
  }